

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNStat.cpp
# Opt level: O3

void __thiscall NaPNStatistics::relate_connectors(NaPNStatistics *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  uint uVar5;
  int iVar6;
  NaVector *pNVar7;
  undefined8 extraout_RDX;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  uVar5 = this->mOutStat;
  iVar6 = 0xc;
  auVar14 = (undefined1  [16])0x0;
  auVar10 = _DAT_0015dcb0;
  do {
    auVar8 = auVar10;
    auVar9 = auVar14;
    auVar10 = pshuflw(auVar9,auVar8,0xfe);
    auVar13 = pshuflw(in_XMM8,auVar8,0x54);
    auVar12._0_8_ = auVar8._8_8_;
    auVar12._8_4_ = auVar8._8_4_;
    auVar12._12_4_ = auVar8._12_4_;
    auVar14 = pshuflw(auVar13,auVar12,0xfe);
    auVar1._4_4_ = uVar5;
    auVar1._0_4_ = uVar5;
    auVar1._8_4_ = uVar5;
    auVar1._12_4_ = uVar5;
    lVar11 = auVar14._0_8_;
    auVar3._4_8_ = auVar1._8_8_;
    auVar3._0_4_ = uVar5 >> lVar11;
    auVar16._0_8_ = auVar3._0_8_ << 0x20;
    auVar16._8_4_ = uVar5 >> lVar11;
    auVar16._12_4_ = uVar5 >> lVar11;
    auVar14 = pshuflw(auVar12,auVar12,0x54);
    auVar2._4_4_ = uVar5;
    auVar2._0_4_ = uVar5;
    auVar2._8_4_ = uVar5;
    auVar2._12_4_ = uVar5;
    lVar11 = auVar14._0_8_;
    auVar4._4_8_ = auVar2._8_8_;
    auVar4._0_4_ = uVar5 >> lVar11;
    auVar15._0_8_ = auVar4._0_8_ << 0x20;
    auVar15._8_4_ = uVar5 >> lVar11;
    auVar15._12_4_ = uVar5 >> lVar11;
    in_XMM8._8_8_ = auVar16._8_8_;
    in_XMM8._0_8_ = auVar15._8_8_;
    auVar14._0_4_ = (uVar5 >> auVar13._0_8_ & 1) + auVar9._0_4_;
    auVar14._4_4_ = (uVar5 >> auVar10._0_8_ & 1) + auVar9._4_4_;
    auVar14._8_4_ = (auVar15._8_4_ & 1) + auVar9._8_4_;
    auVar14._12_4_ = (auVar16._12_4_ & 1) + auVar9._12_4_;
    auVar10._0_4_ = auVar8._0_4_ + 4;
    auVar10._4_4_ = auVar8._4_4_ + 4;
    auVar10._8_4_ = auVar8._8_4_ + 4;
    auVar10._12_4_ = auVar8._12_4_ + 4;
    iVar6 = iVar6 + -4;
  } while (iVar6 != 0);
  auVar8 = auVar8 ^ _DAT_0015cfb0;
  auVar13._0_4_ = -(uint)(-0x7ffffff7 < auVar8._0_4_);
  auVar13._4_4_ = -(uint)(-0x7ffffff7 < auVar8._4_4_);
  auVar13._8_4_ = -(uint)(-0x7ffffff7 < auVar8._8_4_);
  auVar13._12_4_ = -(uint)(-0x7ffffff7 < auVar8._12_4_);
  auVar14 = ~auVar13 & auVar14 | auVar9 & auVar13;
  pNVar7 = NaPetriCnOutput::data(&this->stat);
  (*pNVar7->_vptr_NaVector[4])
            (pNVar7,auVar14._12_4_ + auVar14._4_4_ + auVar14._8_4_ + auVar14._0_4_,extraout_RDX,
             pNVar7->_vptr_NaVector[4]);
  return;
}

Assistant:

void
NaPNStatistics::relate_connectors ()
{
    // n - number of needed statistics
    int	id, n = 0;
    for(id = 0; id < NaSI_number; ++id){
      if(mOutStat & NaSIdToMask(id))
	++n;
    }
    stat.data().new_dim(n);
}